

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

void __thiscall
wabt::WastParser::WastParser
          (WastParser *this,WastLexer *lexer,Errors *errors,WastParseOptions *options)

{
  WastParseOptions *options_local;
  Errors *errors_local;
  WastLexer *lexer_local;
  WastParser *this_local;
  
  this->lexer_ = lexer;
  this->last_module_index_ = 0xffffffff;
  this->errors_ = errors;
  this->options_ = options;
  std::vector<wabt::WastParser::ResolveTypes,_std::allocator<wabt::WastParser::ResolveTypes>_>::
  vector(&this->resolve_types_);
  std::vector<wabt::WastParser::ResolveFuncs,_std::allocator<wabt::WastParser::ResolveFuncs>_>::
  vector(&this->resolve_funcs_);
  memset(&this->tokens_,0,0x98);
  TokenQueue::TokenQueue(&this->tokens_);
  return;
}

Assistant:

WastParser::WastParser(WastLexer* lexer,
                       Errors* errors,
                       WastParseOptions* options)
    : lexer_(lexer), errors_(errors), options_(options) {}